

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::Uniform::Uniform(Uniform *this,char *name_,VarType *type_)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_11);
  glu::VarType::VarType(&this->type,type_);
  return;
}

Assistant:

Uniform (const char* const name_, const glu::VarType& type_) : name(name_), type(type_) {}